

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O3

int Ucs2ComputeLengthProc
              (size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
              Col_ClientData clientData)

{
  uint uVar1;
  uint *puVar2;
  Col_StringFormat CVar3;
  uint *data;
  
  if (chunks->format - COL_UCS1 < 2) {
    *(size_t *)clientData = *clientData + length;
  }
  else if (length != 0) {
    data = (uint *)chunks->data;
    do {
      CVar3 = chunks->format;
      if ((int)CVar3 < 0x11) {
        if (CVar3 - COL_UCS1 < 2) goto LAB_00109d33;
        if (CVar3 == COL_UCS4) {
          uVar1 = *data;
          goto LAB_00109d2c;
        }
      }
      else {
        if (CVar3 == COL_UTF8) {
          uVar1 = Col_Utf8Get((Col_Char1 *)data);
        }
        else {
          if (CVar3 != COL_UTF16) goto LAB_00109d39;
          uVar1 = Col_Utf16Get((Col_Char2 *)data);
        }
LAB_00109d2c:
        if (uVar1 < 0x10000) {
LAB_00109d33:
          *(long *)clientData = *clientData + 1;
        }
        CVar3 = chunks->format;
      }
LAB_00109d39:
      if ((int)CVar3 < 4) {
        if (CVar3 == COL_UCS1) {
          puVar2 = (uint *)((long)data + 1);
        }
        else {
          puVar2 = (uint *)0x0;
          if (CVar3 == COL_UCS2) {
            puVar2 = (uint *)((long)data + 2);
          }
        }
      }
      else if (CVar3 == COL_UCS4) {
        puVar2 = data + 1;
      }
      else if (CVar3 == COL_UTF8) {
        puVar2 = (uint *)Col_Utf8Next((Col_Char1 *)data);
      }
      else {
        puVar2 = (uint *)0x0;
        if (CVar3 == COL_UTF16) {
          puVar2 = (uint *)Col_Utf16Next((Col_Char2 *)data);
        }
      }
      length = length - 1;
      data = puVar2;
    } while (length != 0);
  }
  return 0;
}

Assistant:

static int
Ucs2ComputeLengthProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to the **size_t** length variable to compute. */
    Col_ClientData clientData)
{
    size_t *lengthPtr = (size_t *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    if (chunks->format == COL_UCS1 || chunks->format == COL_UCS2) {
        *lengthPtr += length;
        return 0;
    }
    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        if (c <= COL_CHAR2_MAX) (*lengthPtr)++;
    }
    return 0;
}